

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O0

uint __thiscall zmq::ip_resolver_t::do_if_nametoindex(ip_resolver_t *this,char *ifname_)

{
  uint uVar1;
  char *in_RSI;
  
  uVar1 = if_nametoindex(in_RSI);
  return uVar1;
}

Assistant:

unsigned int zmq::ip_resolver_t::do_if_nametoindex (const char *ifname_)
{
#ifdef HAVE_IF_NAMETOINDEX
    return if_nametoindex (ifname_);
#else
    LIBZMQ_UNUSED (ifname_);
    // The function 'if_nametoindex' is not supported on Windows XP.
    // If we are targeting XP using a vxxx_xp toolset then fail.
    // This is brutal as this code could be run on later windows clients
    // meaning the IPv6 zone_id cannot have an interface name.
    // This could be fixed with a runtime check.
    return 0;
#endif
}